

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O2

ssize_t __thiscall
blc::tools::pipe::read_abi_cxx11_(pipe *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  pipe *this_00;
  allocator<char> local_11;
  
  this_00 = (pipe *)CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_11);
  if (this_00->_block == true) {
    waitRead(this_00,1000);
  }
  push_out(this_00,(&this_00->_in)[(ulong)this_00->_master * 2],(string *)this,
           (&this_00->_inMut)[(ulong)this_00->_master * 2]);
  return (ssize_t)this;
}

Assistant:

std::string blc::tools::pipe::read() const {
	std::string str("");

	if (this->_block == true)
		this->waitRead(1000);
	if (this->_master)
		this->push_out(this->_out, &str, this->_outMut);
	else
		this->push_out(this->_in, &str, this->_inMut);
	return (str);
}